

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

ptls_iovec_t resolve_esni_keys(char *server_name)

{
  uint uVar1;
  int iVar2;
  ptls_iovec_t pVar3;
  undefined1 local_9d0 [4];
  int answer_len;
  ptls_base64_decode_state_t ds;
  ptls_buffer_t decode_buf;
  ns_rr rr;
  ns_msg msg;
  uint8_t answer [1024];
  char *base64;
  char esni_name [256];
  char *server_name_local;
  
  ptls_buffer_init((ptls_buffer_t *)&ds.status,"",0);
  uVar1 = snprintf((char *)&base64,0x100,"_esni.%s",server_name);
  if ((((uVar1 < 0x100) && (iVar2 = res_query(&base64,1,0x10,&msg._msg_ptr,0x400), 0 < iVar2)) &&
      (iVar2 = ns_initparse((u_char *)&msg._msg_ptr,iVar2,(ns_msg *)&rr.rdata), iVar2 == 0)) &&
     (((msg._eom._6_2_ != 0 &&
       (iVar2 = ns_parserr((ns_msg *)&rr.rdata,ns_s_an,0,(ns_rr *)&decode_buf.is_allocated),
       iVar2 == 0)) &&
      (iVar2 = normalize_txt((uint8_t *)rr._1032_8_,(long)(int)(uint)rr.rr_class), iVar2 != 0)))) {
    ptls_base64_decode_init((ptls_base64_decode_state_t *)local_9d0);
    iVar2 = ptls_base64_decode((char *)rr._1032_8_,(ptls_base64_decode_state_t *)local_9d0,
                               (ptls_buffer_t *)&ds.status);
    if (iVar2 == 0) {
      if ((int)decode_buf.off != 0) {
        pVar3 = ptls_iovec_init((void *)ds._8_8_,decode_buf.capacity);
        return pVar3;
      }
      __assert_fail("decode_buf.is_allocated",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/util.h"
                    ,0x141,"ptls_iovec_t resolve_esni_keys(const char *)");
    }
  }
  ptls_buffer_dispose((ptls_buffer_t *)&ds.status);
  pVar3 = ptls_iovec_init((void *)0x0,0);
  return pVar3;
}

Assistant:

static inline ptls_iovec_t resolve_esni_keys(const char *server_name)
{
    char esni_name[256], *base64;
    uint8_t answer[1024];
    ns_msg msg;
    ns_rr rr;
    ptls_buffer_t decode_buf;
    ptls_base64_decode_state_t ds;
    int answer_len;

    ptls_buffer_init(&decode_buf, "", 0);

    if (snprintf(esni_name, sizeof(esni_name), "_esni.%s", server_name) > sizeof(esni_name) - 1)
        goto Error;
    if ((answer_len = res_query(esni_name, ns_c_in, ns_t_txt, answer, sizeof(answer))) <= 0)
        goto Error;
    if (ns_initparse(answer, answer_len, &msg) != 0)
        goto Error;
    if (ns_msg_count(msg, ns_s_an) < 1)
        goto Error;
    if (ns_parserr(&msg, ns_s_an, 0, &rr) != 0)
        goto Error;
    base64 = (void *)ns_rr_rdata(rr);
    if (!normalize_txt((void *)base64, ns_rr_rdlen(rr)))
        goto Error;

    ptls_base64_decode_init(&ds);
    if (ptls_base64_decode(base64, &ds, &decode_buf) != 0)
        goto Error;
    assert(decode_buf.is_allocated);

    return ptls_iovec_init(decode_buf.base, decode_buf.off);
Error:
    ptls_buffer_dispose(&decode_buf);
    return ptls_iovec_init(NULL, 0);
}